

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O3

void __thiscall CompilerStatistics::Finish(CompilerStatistics *this,char *keyName,uint timeMicros)

{
  int *piVar1;
  uint uVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  InplaceStr key;
  InplaceStr local_38;
  
  this->finishTime = timeMicros;
  local_38.begin = keyName;
  sVar4 = strlen(keyName);
  local_38.end = keyName + sVar4;
  if ((this->timers).count != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      bVar3 = InplaceStr::operator==
                        ((InplaceStr *)((long)&(((this->timers).data)->keyName).begin + lVar5),
                         &local_38);
      uVar2 = (this->timers).count;
      if (bVar3) {
        if ((uint)uVar6 < uVar2) {
          piVar1 = (int *)((long)&((this->timers).data)->total + lVar5);
          *piVar1 = *piVar1 + (timeMicros - this->startTime);
          this->startTime = 0;
          return;
        }
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<CompilerStatistics::Timer, 16>::operator[](unsigned int) [T = CompilerStatistics::Timer, N = 16]"
                     );
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x28;
    } while (uVar6 < uVar2);
  }
  __assert_fail("!\"unknown timer\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Statistics.h"
                ,0x39,"void CompilerStatistics::Finish(const char *, unsigned int)");
}

Assistant:

void Finish(const char *keyName, unsigned timeMicros)
	{
		finishTime = timeMicros;

		InplaceStr key = InplaceStr(keyName);

		for(unsigned i = 0; i < timers.size(); i++)
		{
			if(timers[i].keyName == key)
			{
				timers[i].total += timeMicros - startTime;

				startTime = 0;
				return;
			}
		}

		assert(!"unknown timer");
	}